

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRailingType::IfcRailingType(IfcRailingType *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_00816a50;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcRailingType";
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__00861490);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x861360;
  *(undefined8 *)&this->field_0x1c0 = 0x861478;
  *(undefined8 *)&this->field_0x88 = 0x861388;
  *(undefined8 *)&this->field_0x98 = 0x8613b0;
  *(undefined8 *)&this->field_0xf0 = 0x8613d8;
  *(undefined8 *)&this->field_0x148 = 0x861400;
  *(undefined8 *)&this->field_0x180 = 0x861428;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x861450;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcRailingType() : Object("IfcRailingType") {}